

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

TPZVec<float> * __thiscall TPZVec<float>::operator=(TPZVec<float> *this,TPZVec<float> *copy)

{
  float *pfVar1;
  float *pfVar2;
  long lVar3;
  long lVar4;
  
  if (this != copy) {
    (*this->_vptr_TPZVec[3])(this);
    pfVar1 = copy->fStore;
    pfVar2 = this->fStore;
    lVar4 = 0;
    lVar3 = copy->fNElements;
    if (copy->fNElements < 1) {
      lVar3 = lVar4;
    }
    for (; lVar3 != lVar4; lVar4 = lVar4 + 1) {
      pfVar2[lVar4] = pfVar1[lVar4];
    }
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const TPZVec<T> &copy){
    if (this != &copy) {

      Resize(copy.NElements());

      for (int64_t i = 0; i < copy.fNElements; i++)
          fStore[i] = copy.fStore[i];
    }
    return *this;
}